

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall nodesTest_methodTesting_Test::TestBody(nodesTest_methodTesting_Test *this)

{
  char *pcVar1;
  double dVar2;
  undefined1 local_60 [8];
  nodes node1;
  nodes node2;
  AssertionResult gtest_ar_1;
  AssertHelper local_18;
  
  nodes::nodes((nodes *)local_60);
  node2.f_cost_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&node1.f_cost_,"node1.x_","0",(int *)local_60,(int *)&node2.f_cost_);
  if (node1.f_cost_._0_1_ == '\0') {
    testing::Message::Message((Message *)&node2.f_cost_);
    if (node2._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)node2._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
               ,0x33,pcVar1);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&node2.f_cost_);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&node2.f_cost_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&node2);
    goto LAB_001233ee;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&node2);
  nodes::nodes((nodes *)&node1.f_cost_,1,1,0.0,0.0);
  local_18.data_ = (AssertHelperData *)((ulong)local_18.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<double,int>
            ((internal *)&node2.f_cost_,"node2.f_cost_","0",&node2.g_cost_,(int *)&local_18);
  if (node2.f_cost_._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_18);
    if (gtest_ar_1._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_1._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
               ,0x36,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_1.message_,(Message *)&local_18);
LAB_001233c7:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_18);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_1);
    local_18.data_ = (AssertHelperData *)nodes::compute_g((nodes *)&node1.f_cost_,0);
    gtest_ar_1.message_.ptr_._0_4_ = 1;
    testing::internal::CmpHelperEQ<double,int>
              ((internal *)&node2.f_cost_,"node2.compute_g(i)","1",(double *)&local_18,
               (int *)&gtest_ar_1.message_);
    if (node2.f_cost_._0_1_ == '\0') {
      testing::Message::Message((Message *)&local_18);
      if (gtest_ar_1._0_8_ == 0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar_1._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
                 ,0x39,pcVar1);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_1.message_,(Message *)&local_18);
      goto LAB_001233c7;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_1);
    dVar2 = nodes::compute_h((nodes *)&node1.f_cost_,1,1);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&node2.f_cost_,"node2.compute_h(1, 1)","0.0",dVar2,0.0);
    if (node2.f_cost_._0_1_ == '\0') {
      testing::Message::Message((Message *)&local_18);
      if (gtest_ar_1._0_8_ == 0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar_1._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
                 ,0x3b,pcVar1);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_1.message_,(Message *)&local_18);
      goto LAB_001233c7;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_1);
    dVar2 = nodes::compute_f((nodes *)&node1.f_cost_,1,1);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&node2.f_cost_,"node2.compute_f(1, 1)","1.0",dVar2,1.0);
    if (node2.f_cost_._0_1_ == '\0') {
      testing::Message::Message((Message *)&local_18);
      if (gtest_ar_1._0_8_ == 0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar_1._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
                 ,0x3d,pcVar1);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_1.message_,(Message *)&local_18);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_18);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar_1);
  nodes::~nodes((nodes *)&node1.f_cost_);
LAB_001233ee:
  nodes::~nodes((nodes *)local_60);
  return;
}

Assistant:

TEST(nodesTest, methodTesting) {
  nodes node1;

  ASSERT_EQ(node1.x_, 0);

  nodes node2(1, 1, 0, 0);
  ASSERT_EQ(node2.f_cost_, 0);

  int i = 0;
  ASSERT_EQ(node2.compute_g(i), 1);

  ASSERT_DOUBLE_EQ(node2.compute_h(1, 1), 0.0);

  ASSERT_DOUBLE_EQ(node2.compute_f(1, 1), 1.0);
}